

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# recorder.cpp
# Opt level: O2

void __thiscall minibag::Recorder::stopWriting(Recorder *this)

{
  allocator<char> local_31;
  string local_30 [32];
  
  if ((char)miniros::console::g_initialized == '\0') {
    miniros::console::initialize();
  }
  if (stopWriting::loc.initialized_ == false) {
    std::__cxx11::string::string<std::allocator<char>>(local_30,"miniros.unknown_package",&local_31)
    ;
    miniros::console::initializeLogLocation(&stopWriting::loc,local_30,Info);
    std::__cxx11::string::~string(local_30);
  }
  if (stopWriting::loc.level_ != Info) {
    miniros::console::setLogLocationLevel(&stopWriting::loc,Info);
    miniros::console::checkLogLocationEnabled(&stopWriting::loc);
  }
  if (stopWriting::loc.logger_enabled_ == true) {
    miniros::console::print
              ((FilterBase *)0x0,stopWriting::loc.logger_,stopWriting::loc.level_,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/rosbag/recorder.cpp"
               ,0x171,"void minibag::Recorder::stopWriting()","Closing %s.",
               (this->target_filename_)._M_dataplus._M_p);
  }
  minibag::Bag::close();
  rename((this->write_filename_)._M_dataplus._M_p,(this->target_filename_)._M_dataplus._M_p);
  return;
}

Assistant:

void Recorder::stopWriting()
{
  MINIROS_INFO("Closing %s.", target_filename_.c_str());
  bag_.close();
  rename(write_filename_.c_str(), target_filename_.c_str());
}